

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

void test_common<long>(uint length,long value)

{
  bool bVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  _func_int **pp_Var7;
  ulong uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined8 *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  int iVar15;
  undefined1 auVar16 [16];
  shared_ptr<long> pa;
  shared_ptr<long> pb;
  
  uVar8 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar8 = (ulong)(length + 1) * 8;
  }
  pauVar5 = (undefined1 (*) [16])operator_new__(uVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,pauVar5,nosimd::common::free<long>);
  pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<long>);
  _Var4._M_pi = pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pp_Var3 = (_func_int **)(ulong)length;
  *(undefined8 *)((long)*pauVar5 + (long)pp_Var3 * 8) = 0x7f;
  (&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[(long)pp_Var3] = (_func_int **)0x3f;
  auVar16._8_4_ = (int)value;
  auVar16._0_8_ = value;
  auVar16._12_4_ = (int)((ulong)value >> 0x20);
  uVar13 = (int)length >> 1;
  pauVar6 = pauVar5;
  uVar12 = uVar13;
  uVar11 = uVar13;
  if (3 < (int)uVar13) {
    do {
      *pauVar6 = auVar16;
      pauVar6[1] = auVar16;
      pauVar6[2] = auVar16;
      pauVar6[3] = auVar16;
      uVar11 = uVar12 - 4;
      pauVar6 = pauVar6 + 4;
      bVar1 = 7 < uVar12;
      uVar12 = uVar11;
    } while (bVar1);
  }
  if (1 < (int)uVar11) {
    *pauVar6 = auVar16;
    pauVar6[1] = auVar16;
    uVar11 = uVar11 - 2;
    pauVar6 = pauVar6 + 2;
  }
  if (uVar11 != 0) {
    *pauVar6 = auVar16;
  }
  if (length != 0) {
    _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)length;
    *(long *)(pauVar5[-1] + (long)_Var14._M_pi * 8 + 8) = value;
    pp_Var7 = (_func_int **)0x0;
    do {
      if (*(long *)((long)*pauVar5 + (long)pp_Var7 * 8) != value) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = long]";
        *(undefined4 *)(puVar10 + 1) = 0x16;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
    } while (pp_Var3 != pp_Var7);
    _Var9._M_pi = pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    pauVar6 = pauVar5;
    uVar12 = uVar13;
    uVar11 = uVar13;
    if (3 < (int)uVar13) {
      do {
        uVar2 = *(undefined8 *)((long)*pauVar6 + 8);
        (_Var9._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)*pauVar6;
        (_Var9._M_pi)->_M_use_count = (int)uVar2;
        (_Var9._M_pi)->_M_weak_count = (int)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)(pauVar6[1] + 8);
        _Var9._M_pi[1]._vptr__Sp_counted_base = *(_func_int ***)pauVar6[1];
        _Var9._M_pi[1]._M_use_count = (int)uVar2;
        _Var9._M_pi[1]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)(pauVar6[2] + 8);
        _Var9._M_pi[2]._vptr__Sp_counted_base = *(_func_int ***)pauVar6[2];
        _Var9._M_pi[2]._M_use_count = (int)uVar2;
        _Var9._M_pi[2]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)(pauVar6[3] + 8);
        _Var9._M_pi[3]._vptr__Sp_counted_base = *(_func_int ***)pauVar6[3];
        _Var9._M_pi[3]._M_use_count = (int)uVar2;
        _Var9._M_pi[3]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
        uVar11 = uVar12 - 4;
        pauVar6 = pauVar6 + 4;
        _Var9._M_pi = _Var9._M_pi + 4;
        bVar1 = 7 < uVar12;
        uVar12 = uVar11;
      } while (bVar1);
    }
    if (1 < (int)uVar11) {
      uVar2 = *(undefined8 *)((long)*pauVar6 + 8);
      (_Var9._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)*pauVar6;
      (_Var9._M_pi)->_M_use_count = (int)uVar2;
      (_Var9._M_pi)->_M_weak_count = (int)((ulong)uVar2 >> 0x20);
      uVar2 = *(undefined8 *)(pauVar6[1] + 8);
      _Var9._M_pi[1]._vptr__Sp_counted_base = *(_func_int ***)pauVar6[1];
      _Var9._M_pi[1]._M_use_count = (int)uVar2;
      _Var9._M_pi[1]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
      uVar11 = uVar11 - 2;
      pauVar6 = pauVar6 + 2;
      _Var9._M_pi = _Var9._M_pi + 2;
    }
    if (uVar11 != 0) {
      uVar2 = *(undefined8 *)((long)*pauVar6 + 8);
      (_Var9._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)*pauVar6;
      (_Var9._M_pi)->_M_use_count = (int)uVar2;
      (_Var9._M_pi)->_M_weak_count = (int)((ulong)uVar2 >> 0x20);
    }
    if (length != 0) {
      *(undefined8 *)
       ((long)pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
       (long)_Var14._M_pi * 8 + -8) = *(undefined8 *)(pauVar5[-1] + (long)_Var14._M_pi * 8 + 8);
      pp_Var7 = (_func_int **)0x0;
      do {
        if ((&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _vptr__Sp_counted_base)[(long)pp_Var7] != (_func_int **)value) {
          puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar10 = "void test_common(unsigned int, T) [T = long]";
          *(undefined4 *)(puVar10 + 1) = 0x1d;
          *(uint *)((long)puVar10 + 0xc) = length;
          __cxa_throw(puVar10,&Exception::typeinfo,0);
        }
        pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
      } while (pp_Var3 != pp_Var7);
      _Var9._M_pi = pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      uVar11 = uVar13;
      if (3 < (int)uVar13) {
        iVar15 = uVar13 - 7;
        if (uVar13 < 7) {
          iVar15 = 0;
        }
        uVar8 = (ulong)(iVar15 + 3U >> 2);
        pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var14._M_pi;
        memset(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
               uVar8 * 0x40 + 0x40);
        uVar11 = (uVar13 - (iVar15 + 3U & 0x7ffffffc)) - 4;
        _Var9._M_pi = _Var4._M_pi + uVar8 * 4 + 4;
        _Var14._M_pi = pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      }
      if (1 < (int)uVar11) {
        uVar11 = uVar11 - 2;
        _Var9._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        _Var9._M_pi[1]._M_use_count = 0;
        _Var9._M_pi[1]._M_weak_count = 0;
        (_Var9._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
        (_Var9._M_pi)->_M_use_count = 0;
        (_Var9._M_pi)->_M_weak_count = 0;
        _Var9._M_pi = _Var9._M_pi + 2;
      }
      if (uVar11 != 0) {
        (_Var9._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
        (_Var9._M_pi)->_M_use_count = 0;
        (_Var9._M_pi)->_M_weak_count = 0;
      }
      if (length != 0) {
        *(undefined8 *)((long)_Var4._M_pi + (long)_Var14._M_pi * 8 + -8) = 0;
        pp_Var7 = (_func_int **)0x0;
        do {
          if ((&(_Var4._M_pi)->_vptr__Sp_counted_base)[(long)pp_Var7] != (_func_int **)0x0) {
            puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar10 = "void test_common(unsigned int, T) [T = long]";
            *(undefined4 *)(puVar10 + 1) = 0x24;
            *(uint *)((long)puVar10 + 0xc) = length;
            __cxa_throw(puVar10,&Exception::typeinfo,0);
          }
          pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
        } while (pp_Var3 != pp_Var7);
        if (length != 0) {
          pp_Var7 = (_func_int **)0x0;
          do {
            *(_func_int ***)((long)*pauVar5 + (long)pp_Var7 * 8) = pp_Var7;
            pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
          } while (pp_Var3 != pp_Var7);
          _Var9._M_pi = _Var4._M_pi;
          pauVar6 = pauVar5;
          uVar11 = uVar13;
          if (3 < (int)uVar13) {
            do {
              uVar2 = *(undefined8 *)((long)*pauVar6 + 8);
              (_Var9._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)*pauVar6;
              (_Var9._M_pi)->_M_use_count = (int)uVar2;
              (_Var9._M_pi)->_M_weak_count = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(pauVar6[1] + 8);
              _Var9._M_pi[1]._vptr__Sp_counted_base = *(_func_int ***)pauVar6[1];
              _Var9._M_pi[1]._M_use_count = (int)uVar2;
              _Var9._M_pi[1]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(pauVar6[2] + 8);
              _Var9._M_pi[2]._vptr__Sp_counted_base = *(_func_int ***)pauVar6[2];
              _Var9._M_pi[2]._M_use_count = (int)uVar2;
              _Var9._M_pi[2]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
              uVar2 = *(undefined8 *)(pauVar6[3] + 8);
              _Var9._M_pi[3]._vptr__Sp_counted_base = *(_func_int ***)pauVar6[3];
              _Var9._M_pi[3]._M_use_count = (int)uVar2;
              _Var9._M_pi[3]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
              uVar11 = uVar13 - 4;
              pauVar6 = pauVar6 + 4;
              _Var9._M_pi = _Var9._M_pi + 4;
              bVar1 = 7 < uVar13;
              uVar13 = uVar11;
            } while (bVar1);
          }
          if (1 < (int)uVar11) {
            uVar2 = *(undefined8 *)((long)*pauVar6 + 8);
            (_Var9._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)*pauVar6;
            (_Var9._M_pi)->_M_use_count = (int)uVar2;
            (_Var9._M_pi)->_M_weak_count = (int)((ulong)uVar2 >> 0x20);
            uVar2 = *(undefined8 *)(pauVar6[1] + 8);
            _Var9._M_pi[1]._vptr__Sp_counted_base = *(_func_int ***)pauVar6[1];
            _Var9._M_pi[1]._M_use_count = (int)uVar2;
            _Var9._M_pi[1]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
            uVar11 = uVar11 - 2;
            pauVar6 = pauVar6 + 2;
            _Var9._M_pi = _Var9._M_pi + 2;
          }
          if (uVar11 != 0) {
            uVar2 = *(undefined8 *)((long)*pauVar6 + 8);
            (_Var9._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)*pauVar6;
            (_Var9._M_pi)->_M_use_count = (int)uVar2;
            (_Var9._M_pi)->_M_weak_count = (int)((ulong)uVar2 >> 0x20);
          }
          if (length != 0) {
            *(undefined8 *)((long)_Var4._M_pi + (long)_Var14._M_pi * 8 + -8) =
                 *(undefined8 *)(pauVar5[-1] + (long)_Var14._M_pi * 8 + 8);
            pp_Var7 = (_func_int **)0x0;
            do {
              if (pp_Var7 != (&(_Var4._M_pi)->_vptr__Sp_counted_base)[(long)pp_Var7]) {
                puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
                *puVar10 = "void test_common(unsigned int, T) [T = long]";
                *(undefined4 *)(puVar10 + 1) = 0x2d;
                *(uint *)((long)puVar10 + 0xc) = length;
                __cxa_throw(puVar10,&Exception::typeinfo,0);
              }
              pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
            } while (pp_Var3 != pp_Var7);
          }
        }
      }
    }
  }
  if ((*(long *)((long)*pauVar5 + (long)pp_Var3 * 8) == 0x7f) &&
     ((&(_Var4._M_pi)->_vptr__Sp_counted_base)[(long)pp_Var3] == (_func_int **)0x3f)) {
    if (pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar10 = "void test_common(unsigned int, T) [T = long]";
  *(undefined4 *)(puVar10 + 1) = 0x31;
  *(uint *)((long)puVar10 + 0xc) = length;
  __cxa_throw(puVar10,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}